

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

bool __thiscall MipsParser::parseCop2BranchCondition(MipsParser *this,Parser *parser,int *result)

{
  TokenType TVar1;
  bool bVar2;
  MipsParser *this_00;
  int64_t iVar3;
  string *text;
  size_t pos;
  size_t local_20;
  
  this_00 = (MipsParser *)Parser::nextToken(parser);
  TVar1 = *(TokenType *)&(this_00->registers).grs.name._name._M_string_length;
  if (TVar1 == Identifier) {
    local_20 = 0;
    text = &Token::identifierValue((Token *)this_00)->_name;
    bVar2 = decodeCop2BranchCondition(this_00,text,&local_20,result);
  }
  else if (TVar1 == Integer) {
    iVar3 = Token::intValue((Token *)this_00);
    *result = (int)iVar3;
    iVar3 = Token::intValue((Token *)this_00);
    bVar2 = iVar3 < 6;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MipsParser::parseCop2BranchCondition(Parser& parser, int& result)
{
	const Token& token = parser.nextToken();

	if (token.type == TokenType::Integer)
	{
		result = (int) token.intValue();
		return token.intValue() <= 5;
	}

	if (token.type != TokenType::Identifier)
		return false;

	size_t pos = 0;
	return decodeCop2BranchCondition(token.identifierValue().string(),pos,result);
}